

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool prvTidyParseConfigOption(TidyDocImpl *doc,ctmbstr optnam,ctmbstr optval)

{
  int iVar1;
  Bool BVar2;
  ulong uVar3;
  TidyOptionId *pTVar4;
  bool bVar5;
  
  pTVar4 = (TidyOptionId *)0x0;
  uVar3 = 0;
  do {
    iVar1 = prvTidytmbstrcasecmp(optnam,*(ctmbstr *)((long)&option_defs[0].name + uVar3));
    if (iVar1 == 0) {
      pTVar4 = (TidyOptionId *)((long)&option_defs[0].id + uVar3);
      break;
    }
    bVar5 = uVar3 < 0x1688;
    uVar3 = uVar3 + 0x38;
  } while (bVar5);
  if (pTVar4 == (TidyOptionId *)0x0) {
    if (doc->pOptCallback == (TidyOptCallback)0x0) {
      BVar2 = no;
    }
    else {
      BVar2 = (*doc->pOptCallback)(optnam,optval);
    }
    if ((doc->pConfigCallback != (TidyConfigCallback)0x0) &&
       (bVar5 = BVar2 == no, BVar2 = yes, bVar5)) {
      BVar2 = (*doc->pConfigCallback)((TidyDoc)doc,optnam,optval);
      BVar2 = (Bool)(BVar2 != no);
    }
    if (BVar2 == no) {
      prvTidyReportUnknownOption(doc,optnam);
      BVar2 = no;
    }
    return BVar2;
  }
  BVar2 = prvTidyParseConfigValue(doc,*pTVar4,optval);
  return BVar2;
}

Assistant:

Bool TY_(ParseConfigOption)( TidyDocImpl* doc, ctmbstr optnam, ctmbstr optval )
{
    const TidyOptionImpl* option = TY_(lookupOption)( optnam );
    Bool isDeprecated = isOptionDeprecated( optnam );
    Bool status = ( option != NULL ) && !isDeprecated;
    if ( !status )
    {
        /* Unknown or deprecated, so check to see if the user application
           wants to deal with it first. */
        if (NULL != doc->pOptCallback)
            status = (*doc->pOptCallback)( optnam, optval );
        if (NULL != doc->pConfigCallback )
            status = status || (*doc->pConfigCallback)( tidyImplToDoc(doc), optnam, optval );
        if (!status && isDeprecated)
            status = subDeprecatedOption( doc, optnam, optval);
        if (!status)
            TY_(ReportUnknownOption)( doc, optnam );
    }
    else
        status = TY_(ParseConfigValue)( doc, option->id, optval );

    return status;
}